

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberParser.h
# Opt level: O0

Token __thiscall
slang::parsing::NumberParser::parseReal<slang::parsing::Preprocessor>
          (NumberParser *this,Preprocessor *stream)

{
  char cVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  size_type __pos;
  SourceLocation in_RDI;
  double dVar5;
  anon_class_40_5_86db9fac checkForDigit;
  size_t j;
  char c;
  size_t i;
  size_type len;
  string_view raw;
  Token literal;
  NumberParser *in_stack_ffffffffffffff40;
  DiagCode missingCode;
  undefined4 in_stack_ffffffffffffff50;
  DiagCode in_stack_ffffffffffffff54;
  anon_class_40_5_86db9fac *this_00;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  real_t in_stack_ffffffffffffff90;
  size_type __pos_00;
  anon_class_40_5_86db9fac local_60;
  real_t local_38;
  SourceLocation local_30;
  undefined4 local_26;
  NumericTokenFlags local_21 [17];
  Token local_10;
  
  local_10 = Preprocessor::consume
                       ((Preprocessor *)
                        CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  local_21[0] = Token::numericFlags(&local_10);
  bVar2 = NumericTokenFlags::outOfRange(local_21);
  if (bVar2) {
    dVar5 = Token::realValue((Token *)in_stack_ffffffffffffff40);
    if ((dVar5 != 0.0) || (NAN(dVar5))) {
      local_60.literal._4_4_ = 0xb0003;
      local_60.this = (NumberParser *)Token::location(&local_10);
      addDiag(in_stack_ffffffffffffff40,in_stack_ffffffffffffff54,in_RDI);
      dVar5 = std::numeric_limits<double>::max();
      real_t::real_t((real_t *)((long)&local_60 + 0x10),dVar5);
      Diagnostic::operator<<
                ((Diagnostic *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                 in_stack_ffffffffffffff90);
    }
    else {
      local_26 = 0xc0003;
      local_30 = Token::location(&local_10);
      addDiag(in_stack_ffffffffffffff40,in_stack_ffffffffffffff54,in_RDI);
      dVar5 = std::numeric_limits<double>::denorm_min();
      real_t::real_t(&local_38,dVar5);
      Diagnostic::operator<<
                ((Diagnostic *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                 in_stack_ffffffffffffff90);
    }
  }
  local_60._0_16_ =
       Token::rawText((Token *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::length
                    ((basic_string_view<char,_std::char_traits<char>_> *)&local_60);
  for (__pos_00 = 0; __pos_00 < sVar3; __pos_00 = __pos_00 + 1) {
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)&local_60,__pos_00);
    missingCode = in_RDI._4_4_;
    cVar1 = *pvVar4;
    __pos = __pos_00 + 1;
    this_00 = &local_60;
    if (cVar1 == '.') {
      parseReal<slang::parsing::Preprocessor>::anon_class_40_5_86db9fac::operator()
                (this_00,missingCode);
    }
    else if ((cVar1 == 'e') || (cVar1 == 'E')) {
      if ((__pos < sVar3) &&
         (pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)&local_60,__pos),
         *pvVar4 != '+')) {
        std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                  ((basic_string_view<char,_std::char_traits<char>_> *)&local_60,__pos);
      }
      parseReal<slang::parsing::Preprocessor>::anon_class_40_5_86db9fac::operator()
                (this_00,missingCode);
    }
  }
  return local_10;
}

Assistant:

Token parseReal(TStream& stream) {
        // have to check for overflow here, now that we know this is actually a real
        auto literal = stream.consume();
        if (literal.numericFlags().outOfRange()) {
            if (literal.realValue() == 0) {
                addDiag(diag::RealLiteralUnderflow, literal.location())
                    << real_t(std::numeric_limits<double>::denorm_min());
            }
            else {
                SLANG_ASSERT(!std::isfinite(literal.realValue()));
                addDiag(diag::RealLiteralOverflow, literal.location())
                    << real_t(std::numeric_limits<double>::max());
            }
        }

        // Enforce extra rules about where digits and underscores
        // are allowed to go in a real literal.
        auto raw = literal.rawText();
        auto len = raw.length();
        for (size_t i = 0; i < len; i++) {
            char c = raw[i];
            size_t j = i + 1;

            auto checkForDigit = [&](DiagCode missingCode) {
                if (j == len || !isDecimalDigit(raw[j])) {
                    auto code = (j < len && raw[j] == '_') ? diag::DigitsLeadingUnderscore
                                                           : missingCode;
                    addDiag(code, literal.location() + j);
                }
            };

            if (c == '.') {
                checkForDigit(diag::MissingFractionalDigits);
            }
            else if (c == 'e' || c == 'E') {
                if (j < len && (raw[j] == '+' || raw[j] == '-'))
                    j++;

                checkForDigit(diag::MissingExponentDigits);
            }
        }

        return literal;
    }